

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBUnattenuateRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if (0 < width) {
    lVar4 = 0;
    do {
      bVar1 = src_argb[lVar4 * 4 + 3];
      uVar3 = (ushort)fixed_invtbl8[bVar1];
      uVar6 = (uint)src_argb[lVar4 * 4] * (uint)uVar3 >> 8;
      if (0xfe < uVar6) {
        uVar6 = 0xff;
      }
      bVar2 = src_argb[lVar4 * 4 + 2];
      uVar5 = (uint)src_argb[lVar4 * 4 + 1] * (uint)uVar3 >> 8;
      dst_argb[lVar4 * 4] = (uint8_t)uVar6;
      if (0xfe < uVar5) {
        uVar5 = 0xff;
      }
      uVar6 = (uint)uVar3 * (uint)bVar2 >> 8;
      dst_argb[lVar4 * 4 + 1] = (uint8_t)uVar5;
      if (0xfe < uVar6) {
        uVar6 = 0xff;
      }
      dst_argb[lVar4 * 4 + 2] = (uint8_t)uVar6;
      dst_argb[lVar4 * 4 + 3] = bVar1;
      lVar4 = lVar4 + 1;
    } while (width != (int)lVar4);
  }
  return;
}

Assistant:

void ARGBUnattenuateRow_C(const uint8_t* src_argb,
                          uint8_t* dst_argb,
                          int width) {
  int i;
  for (i = 0; i < width; ++i) {
    uint32_t b = src_argb[0];
    uint32_t g = src_argb[1];
    uint32_t r = src_argb[2];
    const uint32_t a = src_argb[3];
    const uint32_t ia = fixed_invtbl8[a] & 0xffff;  // 8.8 fixed point
    b = (b * ia) >> 8;
    g = (g * ia) >> 8;
    r = (r * ia) >> 8;
    // Clamping should not be necessary but is free in assembly.
    dst_argb[0] = clamp255(b);
    dst_argb[1] = clamp255(g);
    dst_argb[2] = clamp255(r);
    dst_argb[3] = a;
    src_argb += 4;
    dst_argb += 4;
  }
}